

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

bool __thiscall re2::IsValidCaptureName(re2 *this,StringPiece *name)

{
  re2 rVar1;
  ulong uVar2;
  
  if ((int)name != 0) {
    if ((int)name < 1) {
      return true;
    }
    uVar2 = 0;
    while ((rVar1 = this[uVar2],
           (byte)((char)rVar1 + 0x9fU) < 0x1a || (byte)((char)rVar1 - 0x30U) < 10 ||
           (rVar1 == (re2)0x5f || (byte)((char)rVar1 + 0xbfU) < 0x1a))) {
      uVar2 = uVar2 + 1;
      if (((ulong)name & 0xffffffff) == uVar2) {
        return ((ulong)name & 0xffffffff) <= uVar2;
      }
    }
  }
  return false;
}

Assistant:

static bool IsValidCaptureName(const StringPiece& name) {
  if (name.size() == 0)
    return false;
  for (int i = 0; i < name.size(); i++) {
    int c = name[i];
    if (('0' <= c && c <= '9') ||
        ('a' <= c && c <= 'z') ||
        ('A' <= c && c <= 'Z') ||
        c == '_')
      continue;
    return false;
  }
  return true;
}